

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_int_2_suite::test_clear(void)

{
  size_type local_68;
  undefined4 local_5c;
  moment<int,_2> filter;
  
  filter.member.window.super_span<int,_2UL>.member.size = 0;
  filter.member.window.super_span<int,_2UL>.member.next = 2;
  filter.member.mean = 0;
  filter.member.window.super_span<int,_2UL>.member.data = (pointer)&filter;
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&filter,1);
  local_68 = filter.member.window.super_span<int,_2UL>.member.size;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1c6,"void mean_int_2_suite::test_clear()",&local_68,&local_5c);
  filter.member.mean = 0;
  filter.member.window.super_span<int,_2UL>.member.size = 0;
  local_68 = 0;
  filter.member.window.super_span<int,_2UL>.member.next = 2;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1c8,"void mean_int_2_suite::test_clear()",&local_68,&local_5c);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&filter,2);
  local_68 = filter.member.window.super_span<int,_2UL>.member.size;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ca,"void mean_int_2_suite::test_clear()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,filter.member.mean);
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1cb,"void mean_int_2_suite::test_clear()",&local_68,&local_5c);
  return;
}

Assistant:

void test_clear()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(2);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 2);
}